

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

void Abc_ZddPrint_rec(Abc_ZddMan *p,int a,int *pPath,int Size)

{
  Abc_ZddObj *pAVar1;
  int local_fc;
  uint local_f8;
  int i;
  int pComb [24];
  int pPerm [24];
  Abc_ZddObj *A;
  int Size_local;
  int *pPath_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  if (a != 0) {
    if (a == 1) {
      if (0x18 < p->nPermSize) {
        __assert_fail("p->nPermSize <= 24",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilPerm.c"
                      ,0x2b3,"void Abc_ZddPrint_rec(Abc_ZddMan *, int, int *, int)");
      }
      for (local_fc = 0; local_fc < Size; local_fc = local_fc + 1) {
        (&local_f8)[local_fc] = p->pV2TI[pPath[local_fc]] << 0x10 | p->pV2TJ[pPath[local_fc]];
      }
      Abc_ZddCombPrint((int *)&local_f8,Size);
      Abc_ZddComb2Perm((int *)&local_f8,Size,pComb + 0x16,p->nPermSize);
      Abc_ZddPermPrint(pComb + 0x16,p->nPermSize);
    }
    else {
      pAVar1 = Abc_ZddNode(p,a);
      Abc_ZddPrint_rec(p,pAVar1->False,pPath,Size);
      pPath[Size] = *(uint *)pAVar1 & 0x7fffffff;
      Abc_ZddPrint_rec(p,pAVar1->True,pPath,Size + 1);
    }
  }
  return;
}

Assistant:

void Abc_ZddPrint_rec( Abc_ZddMan * p, int a, int * pPath, int Size )
{
    Abc_ZddObj * A;  
    if ( a == 0 ) return;
//    if ( a == 1 ) { Abc_ZddPermPrint( pPath, Size ); return; }
    if ( a == 1 )
    { 
        int pPerm[24], pComb[24], i;
        assert( p->nPermSize <= 24 );
        for ( i = 0; i < Size; i++ )
            pComb[i] = (p->pV2TI[pPath[i]] << 16) | p->pV2TJ[pPath[i]];
        Abc_ZddCombPrint( pComb, Size ); 
        Abc_ZddComb2Perm( pComb, Size, pPerm, p->nPermSize );
        Abc_ZddPermPrint( pPerm, p->nPermSize );
        return; 
    }
    A = Abc_ZddNode( p, a );
    Abc_ZddPrint_rec( p, A->False, pPath, Size );
    pPath[Size] = A->Var;
    Abc_ZddPrint_rec( p, A->True, pPath, Size + 1 );
}